

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void anon_unknown.dwarf_72cb0a::CreateGeneratedSource
               (cmLocalGenerator *lg,string *output,OutputRole role,cmCommandOrigin origin,
               cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  string *this;
  string sStack_a8;
  _Alloc_hider local_88;
  char *local_80;
  cmAlphaNum local_58;
  
  this = (string *)&sStack_a8;
  sVar3 = cmGeneratorExpression::Find(output);
  if (sVar3 == 0xffffffffffffffff) {
    bVar2 = cmMakefile::CanIWriteThisFile(lg->Makefile,output);
    if (bVar2) {
      lVar4 = std::__cxx11::string::find_first_of((char *)output,0x61ab60);
      if (lVar4 == -1) {
        if (origin != Generator) {
          return;
        }
        cmMakefile::GetOrCreateGeneratedSource(lg->Makefile,output);
        return;
      }
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_88._M_p = (pointer)((ulong)(role != Primary) * 4 + 6);
      local_80 = "BYPRODUCTS";
      if (role == Primary) {
        local_80 = "OUTPUT";
      }
      local_58.View_._M_len = 0xf;
      local_58.View_._M_str = " containing a \"";
      cmStrCat<char,char[18]>
                (&sStack_a8,(cmAlphaNum *)&local_88,&local_58,(output->_M_dataplus)._M_p + lVar4,
                 (char (*) [18])"\" is not allowed.");
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_a8,lfbt);
      this = (string *)&sStack_a8;
    }
    else {
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_80 = "BYPRODUCTS";
      if (role == Primary) {
        local_80 = "OUTPUT";
      }
      local_88._M_p = (pointer)((ulong)(role != Primary) * 4 + 6);
      local_58.View_._M_len = 8;
      local_58.View_._M_str = " path\n  ";
      cmStrCat<std::__cxx11::string,char[55]>
                (&sStack_a8,(cmAlphaNum *)&local_88,&local_58,output,
                 (char (*) [55])"\nin a source directory as an output of custom command.");
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_a8,lfbt);
    }
  }
  else {
    pcVar1 = lg->GlobalGenerator->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "Generator expressions in custom command outputs are not implemented!",
               (allocator<char> *)&local_58);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_88,lfbt);
    this = (string *)&local_88;
  }
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

void CreateGeneratedSource(cmLocalGenerator& lg, const std::string& output,
                           cmLocalGenerator::OutputRole role,
                           cmCommandOrigin origin,
                           const cmListFileBacktrace& lfbt)
{
  if (cmGeneratorExpression::Find(output) != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Generator expressions in custom command outputs are not implemented!",
      lfbt);
    return;
  }

  // Make sure the file will not be generated into the source
  // directory during an out of source build.
  if (!lg.GetMakefile()->CanIWriteThisFile(output)) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " path\n  ", output,
               "\nin a source directory as an output of custom command."),
      lfbt);
    return;
  }

  // Make sure the output file name has no invalid characters.
  std::string::size_type pos = output.find_first_of("#<>");
  if (pos != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " containing a \"", output[pos],
               "\" is not allowed."),
      lfbt);
    return;
  }

  // Outputs without generator expressions from the project are already
  // created and marked as generated.  Do not mark them again, because
  // other commands might have overwritten the property.
  if (origin == cmCommandOrigin::Generator) {
    lg.GetMakefile()->GetOrCreateGeneratedSource(output);
  }
}